

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_merge.cpp
# Opt level: O2

bool __thiscall BamTools::MergeTool::MergeToolPrivate::Run(MergeToolPrivate *this)

{
  char cVar1;
  bool bVar2;
  __type _Var3;
  string *psVar4;
  istream *piVar5;
  ostream *poVar6;
  MergeSettings *pMVar7;
  BamMultiReader reader;
  BamWriter writer;
  BamRegion local_278;
  CompressionMode local_264;
  string mergedHeader;
  RefVector references;
  ifstream filelist;
  int local_208;
  int local_180;
  int local_17c;
  
  pMVar7 = this->m_settings;
  if ((pMVar7->HasInput == false) && (pMVar7->HasInputFilelist == false)) {
    psVar4 = Options::StandardIn_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pMVar7->InputFiles,psVar4);
    pMVar7 = this->m_settings;
  }
  if (pMVar7->HasInputFilelist == true) {
    std::ifstream::ifstream(&filelist,(pMVar7->InputFilelist)._M_dataplus._M_p,_S_in);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "bamtools merge ERROR: could not open input BAM file list... Aborting."
                              );
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    else {
      mergedHeader._M_dataplus._M_p = (pointer)&mergedHeader.field_2;
      mergedHeader._M_string_length = 0;
      mergedHeader.field_2._M_local_buf[0] = '\0';
      while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&filelist,(string *)&mergedHeader),
            ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->m_settings->InputFiles,&mergedHeader);
      }
      std::__cxx11::string::~string((string *)&mergedHeader);
    }
    std::ifstream::~ifstream(&filelist);
    if (cVar1 == '\0') {
      return false;
    }
  }
  BamMultiReader::BamMultiReader(&reader);
  bVar2 = BamMultiReader::Open(&reader,&this->m_settings->InputFiles);
  if (!bVar2) {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "bamtools merge ERROR: could not open input BAM file(s)... Aborting.");
    std::endl<char,std::char_traits<char>>(poVar6);
    bVar2 = false;
    goto LAB_0011f28a;
  }
  BamMultiReader::GetHeaderText_abi_cxx11_(&mergedHeader,&reader);
  BamMultiReader::GetReferenceData(&references,&reader);
  pMVar7 = this->m_settings;
  psVar4 = Options::StandardOut_abi_cxx11_();
  _Var3 = std::operator==(&pMVar7->OutputFilename,psVar4);
  local_264 = Compressed;
  if (_Var3) {
    local_264 = this->m_settings->IsForceCompression ^ Uncompressed;
  }
  BamWriter::BamWriter(&writer);
  BamWriter::SetCompressionMode(&writer,&local_264);
  bVar2 = BamWriter::Open(&writer,&this->m_settings->OutputFilename,&mergedHeader,&references);
  if (bVar2) {
    if (this->m_settings->HasRegion == false) {
      BamAlignment::BamAlignment((BamAlignment *)&filelist);
      while (bVar2 = BamMultiReader::GetNextAlignmentCore(&reader,(BamAlignment *)&filelist), bVar2)
      {
        BamWriter::SaveAlignment(&writer,(BamAlignment *)&filelist);
      }
    }
    else {
      local_278.LeftRefID = -1;
      local_278.LeftPosition = -1;
      local_278.RightRefID = -1;
      local_278.RightPosition = -1;
      bVar2 = Utilities::ParseRegionString(&this->m_settings->Region,&reader,&local_278);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "bamtools merge ERROR: could not parse REGION - ");
        poVar6 = std::operator<<(poVar6,(string *)&this->m_settings->Region);
        std::endl<char,std::char_traits<char>>(poVar6);
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "Check that REGION is in valid format (see documentation) and that the coordinates are valid"
                                );
        std::endl<char,std::char_traits<char>>(poVar6);
        BamMultiReader::Close(&reader);
        BamWriter::Close(&writer);
        goto LAB_0011f152;
      }
      _filelist = 1;
      BamMultiReader::LocateIndexes(&reader,(IndexType *)&filelist);
      bVar2 = BamMultiReader::HasIndexes(&reader);
      if (bVar2) {
        bVar2 = BamMultiReader::SetRegion
                          (&reader,&local_278.LeftRefID,&local_278.LeftPosition,
                           &local_278.RightRefID,&local_278.RightPosition);
        if (!bVar2) {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "bamtools merge ERROR: set region failed. Check that REGION describes a valid range"
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
          BamMultiReader::Close(&reader);
          goto LAB_0011f152;
        }
        BamAlignment::BamAlignment((BamAlignment *)&filelist);
        while (bVar2 = BamMultiReader::GetNextAlignmentCore(&reader,(BamAlignment *)&filelist),
              bVar2) {
          BamWriter::SaveAlignment(&writer,(BamAlignment *)&filelist);
        }
      }
      else {
        BamAlignment::BamAlignment((BamAlignment *)&filelist);
        while (bVar2 = BamMultiReader::GetNextAlignmentCore(&reader,(BamAlignment *)&filelist),
              bVar2) {
          if ((((local_278.LeftRefID <= local_180) &&
               (local_278.LeftPosition <= local_208 + local_17c)) &&
              (local_180 <= local_278.RightRefID)) && (local_17c <= local_278.RightPosition)) {
            BamWriter::SaveAlignment(&writer,(BamAlignment *)&filelist);
          }
        }
      }
    }
    BamAlignment::~BamAlignment((BamAlignment *)&filelist);
    BamMultiReader::Close(&reader);
    bVar2 = true;
    BamWriter::Close(&writer);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"bamtools merge ERROR: could not open ");
    poVar6 = std::operator<<(poVar6,(string *)&this->m_settings->OutputFilename);
    poVar6 = std::operator<<(poVar6," for writing.");
    std::endl<char,std::char_traits<char>>(poVar6);
    BamMultiReader::Close(&reader);
LAB_0011f152:
    bVar2 = false;
  }
  BamWriter::~BamWriter(&writer);
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::~vector(&references);
  std::__cxx11::string::~string((string *)&mergedHeader);
LAB_0011f28a:
  BamMultiReader::~BamMultiReader(&reader);
  return bVar2;
}

Assistant:

bool MergeTool::MergeToolPrivate::Run()
{

    // set to default input if none provided
    if (!m_settings->HasInput && !m_settings->HasInputFilelist) {
        m_settings->InputFiles.push_back(Options::StandardIn());
    }

    // add files in the filelist to the input file list
    if (m_settings->HasInputFilelist) {

        std::ifstream filelist(m_settings->InputFilelist.c_str(), std::ios::in);
        if (!filelist.is_open()) {
            std::cerr << "bamtools merge ERROR: could not open input BAM file list... Aborting."
                      << std::endl;
            return false;
        }

        std::string line;
        while (std::getline(filelist, line)) {
            m_settings->InputFiles.push_back(line);
        }
    }

    // opens the BAM files (by default without checking for indexes)
    BamMultiReader reader;
    if (!reader.Open(m_settings->InputFiles)) {
        std::cerr << "bamtools merge ERROR: could not open input BAM file(s)... Aborting."
                  << std::endl;
        return false;
    }

    // retrieve header & reference dictionary info
    std::string mergedHeader = reader.GetHeaderText();
    RefVector references = reader.GetReferenceData();

    // determine compression mode for BamWriter
    bool writeUncompressed =
        (m_settings->OutputFilename == Options::StandardOut() && !m_settings->IsForceCompression);
    BamWriter::CompressionMode compressionMode = BamWriter::Compressed;
    if (writeUncompressed) {
        compressionMode = BamWriter::Uncompressed;
    }

    // open BamWriter
    BamWriter writer;
    writer.SetCompressionMode(compressionMode);
    if (!writer.Open(m_settings->OutputFilename, mergedHeader, references)) {
        std::cerr << "bamtools merge ERROR: could not open " << m_settings->OutputFilename
                  << " for writing." << std::endl;
        reader.Close();
        return false;
    }

    // if no region specified, store entire contents of file(s)
    if (!m_settings->HasRegion) {
        BamAlignment al;
        while (reader.GetNextAlignmentCore(al)) {
            writer.SaveAlignment(al);
        }
    }

    // otherwise attempt to use region as constraint
    else {

        // if region string parses OK
        BamRegion region;
        if (Utilities::ParseRegionString(m_settings->Region, reader, region)) {

            // attempt to find index files
            reader.LocateIndexes();

            // if index data available for all BAM files, we can use SetRegion
            if (reader.HasIndexes()) {

                // attempt to use SetRegion(), if failed report error
                if (!reader.SetRegion(region.LeftRefID, region.LeftPosition, region.RightRefID,
                                      region.RightPosition)) {
                    std::cerr << "bamtools merge ERROR: set region failed. Check that REGION "
                                 "describes a valid range"
                              << std::endl;
                    reader.Close();
                    return false;
                }

                // everything checks out, just iterate through specified region, storing alignments
                BamAlignment al;
                while (reader.GetNextAlignmentCore(al)) {
                    writer.SaveAlignment(al);
                }
            }

            // no index data available, we have to iterate through until we
            // find overlapping alignments
            else {
                BamAlignment al;
                while (reader.GetNextAlignmentCore(al)) {
                    if ((al.RefID >= region.LeftRefID) &&
                        ((al.Position + al.Length) >= region.LeftPosition) &&
                        (al.RefID <= region.RightRefID) && (al.Position <= region.RightPosition)) {
                        writer.SaveAlignment(al);
                    }
                }
            }
        }

        // error parsing REGION string
        else {
            std::cerr << "bamtools merge ERROR: could not parse REGION - " << m_settings->Region
                      << std::endl;
            std::cerr << "Check that REGION is in valid format (see documentation) and that the "
                         "coordinates are valid"
                      << std::endl;
            reader.Close();
            writer.Close();
            return false;
        }
    }

    // clean & exit
    reader.Close();
    writer.Close();
    return true;
}